

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::emitEnumDefinition(PrintC *this,TypeEnum *ct)

{
  EmitXml *pEVar1;
  pointer puVar2;
  _Base_ptr p_Var3;
  LowlevelError *this_00;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  allocator local_61;
  uint local_60;
  type_metatype local_5c;
  TypeEnum *local_58;
  string local_50;
  
  if ((ct->super_TypeBase).super_Datatype.name._M_string_length != 0) {
    PrintLanguage::pushMod(&this->super_PrintLanguage);
    local_5c = (ct->super_TypeBase).super_Datatype.metatype;
    (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"typedef enum",0);
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
    local_60 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"{",8);
    (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    p_Var3 = (ct->namemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(ct->namemap)._M_t._M_impl.super__Rb_tree_header;
    local_58 = ct;
    while ((_Rb_tree_header *)p_Var3 != p_Var4) {
      bVar5 = local_5c == TYPE_INT;
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,p_Var3[1]._M_parent,5);
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"=",8);
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])
                (this,*(undefined8 *)(p_Var3 + 1),
                 (ulong)(uint)(local_58->super_TypeBase).super_Datatype.size,(ulong)bVar5,0,0);
      PrintLanguage::recurse(&this->super_PrintLanguage);
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,";",8);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      if ((_Rb_tree_header *)p_Var3 != p_Var4) {
        (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
      }
    }
    puVar2 = (this->super_PrintLanguage).modstack.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pEVar1 = (this->super_PrintLanguage).emit;
    (this->super_PrintLanguage).mods = puVar2[-1];
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2 + -1;
    (*pEVar1->_vptr_EmitXml[0x23])(pEVar1,(ulong)local_60);
    (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"}",8);
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])
              (pEVar1,(local_58->super_TypeBase).super_Datatype.name._M_dataplus._M_p,8);
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,";",8);
    return;
  }
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])(this);
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_50,"Trying to save unnamed enumeration",&local_61);
  LowlevelError::LowlevelError(this_00,&local_50);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void PrintC::emitEnumDefinition(const TypeEnum *ct)

{
  map<uintb,string>::const_iterator iter;

  if (ct->getName().size()==0) {
    clear();
    throw LowlevelError("Trying to save unnamed enumeration");
  }

  pushMod();
  bool sign = (ct->getMetatype() == TYPE_INT);
  emit->tagLine();
  emit->print("typedef enum",EmitXml::keyword_color);
  emit->spaces(1);
  int4 id = emit->startIndent();
  emit->print("{");
  emit->tagLine();
  iter = ct->beginEnum();
  while(iter!=ct->endEnum()) {
    emit->print((*iter).second.c_str(),EmitXml::const_color);
    emit->spaces(1);
    emit->print("=",EmitXml::no_color);
    emit->spaces(1);
    push_integer((*iter).first,ct->getSize(),sign,(Varnode *)0,
		 (PcodeOp *)0);
    recurse();
    emit->print(";");
    ++iter;
    if (iter != ct->endEnum())
      emit->tagLine();
  }
  popMod();
  emit->stopIndent(id);
  emit->tagLine();
  emit->print("}");
  emit->spaces(1);
  emit->print(ct->getName().c_str());
  emit->print(";");
}